

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxFacts.cpp
# Opt level: O2

bool slang::syntax::SyntaxFacts::isAllowedInProgram(SyntaxKind kind)

{
  bool bVar1;
  
  if ((((0x2c < kind - FinalBlock) ||
       ((0x10000210c001U >> ((ulong)(kind - FinalBlock) & 0x3f) & 1) == 0)) &&
      ((0x2c < kind - CaseGenerate ||
       ((0x100008000801U >> ((ulong)(kind - CaseGenerate) & 0x3f) & 1) == 0)))) &&
     (((kind != LoopGenerate && (kind != PortDeclaration)) && (kind != TimeUnitsDeclaration)))) {
    bVar1 = isModuleCommonDecl(kind);
    return bVar1;
  }
  return true;
}

Assistant:

bool SyntaxFacts::isAllowedInProgram(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::PortDeclaration:
        case SyntaxKind::ContinuousAssign:
        case SyntaxKind::InitialBlock:
        case SyntaxKind::FinalBlock:
        case SyntaxKind::ConcurrentAssertionMember:
        case SyntaxKind::HierarchyInstantiation:
        case SyntaxKind::CheckerInstantiation:
        case SyntaxKind::TimeUnitsDeclaration:
        case SyntaxKind::LoopGenerate:
        case SyntaxKind::CaseGenerate:
        case SyntaxKind::IfGenerate:
        case SyntaxKind::GenerateRegion:
        case SyntaxKind::GenerateBlock:
            return true;
        default:
            return isModuleCommonDecl(kind);
    }
}